

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::setupViewports
          (DrawTestBase *this,TEST_TYPE type,GLuint iteration_index)

{
  TestError *pTVar1;
  PROVOKING_VERTEX provoking;
  DEPTH_RANGE_METHOD method_2;
  SCISSOR_METHOD method_1;
  VIEWPORT_METHOD method;
  GLuint iteration_index_local;
  TEST_TYPE type_local;
  DrawTestBase *this_local;
  
  switch(type) {
  case VIEWPORT:
    if (2 < iteration_index) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xb57);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    setup4x4Viewport(this,iteration_index);
    break;
  case SCISSOR:
    if (2 < iteration_index) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xb67);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    setup4x4Scissor(this,iteration_index,false);
    break;
  case DEPTHRANGE:
    if (1 < iteration_index) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xb76);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    setup16x2Depths(this,iteration_index);
    break;
  case PROVOKING:
    if (1 < iteration_index) {
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xb85);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    setup2x2Viewport(this,iteration_index);
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0xb8b);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void DrawTestBase::setupViewports(TEST_TYPE type, GLuint iteration_index)
{
	switch (type)
	{
	case VIEWPORT:
	{
		VIEWPORT_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
		case 2:
			method = (VIEWPORT_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup4x4Viewport(method);
	}
	break;
	case SCISSOR:
	{
		SCISSOR_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
		case 2:
			method = (SCISSOR_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup4x4Scissor(method, false /* set_zeros */);
	}
	break;
	case DEPTHRANGE:
	{
		DEPTH_RANGE_METHOD method;
		switch (iteration_index)
		{
		case 0:
		case 1:
			method = (DEPTH_RANGE_METHOD)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup16x2Depths(method);
	}
	break;
	case PROVOKING:
	{
		PROVOKING_VERTEX provoking;
		switch (iteration_index)
		{
		case 0:
		case 1:
			provoking = (PROVOKING_VERTEX)iteration_index;
			break;
		default:
			TCU_FAIL("Invalid value");
		}
		setup2x2Viewport(provoking);
	}
	break;
	default:
		TCU_FAIL("Invalid enum");
	}
}